

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  _Var1;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  _Var2;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  _Var3;
  ParamIterator<aom_rc_mode> PVar4;
  
  (this->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_010591d0;
  this_00 = (this->current_value_).
            super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ;
  if (_Var3.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
          )0x0;
  PVar4.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                 super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                 _M_head_impl.impl_;
  if (PVar4.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)PVar4.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
  super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>._M_head_impl.impl_ =
       (unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
        )0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->end_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->end_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ._M_head_impl =
       (this->end_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ;
  if (_Var3.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
          )0x0;
  PVar4.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (this->end_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                 super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                 _M_head_impl.impl_;
  if (PVar4.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)PVar4.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
  super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>._M_head_impl.impl_ =
       (unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
        )0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->begin_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->begin_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ._M_head_impl =
       (this->begin_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
  ;
  if (_Var3.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>_*,_false>
          )0x0;
  PVar4.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (this->begin_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                 super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                 _M_head_impl.impl_;
  if (PVar4.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)PVar4.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
  super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>._M_head_impl.impl_ =
       (unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
        )0x0;
  return;
}

Assistant:

~IteratorImpl() override {}